

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeCanonicalizer.cpp
# Opt level: O1

Action __thiscall
psy::C::TypeCanonicalizer::visitDeclarator_COMMON(TypeCanonicalizer *this,DeclaratorSyntax *node)

{
  DeclarationCategory DVar1;
  SymbolKind SVar2;
  Action AVar3;
  int iVar4;
  Symbol *this_00;
  MIXIN_TypeableDeclarationSymbol *pMVar5;
  undefined4 extraout_var;
  Scope *pSVar6;
  Type *pTVar7;
  undefined4 extraout_var_00;
  ostream *poVar8;
  
  this_00 = &SemanticModel::declarationBy(this->semaModel_,node)->super_Symbol;
  if (this_00 == (Symbol *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
               ,0x60);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    iVar4 = 0x78;
LAB_002ea37e:
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
LAB_002ea4e1:
    AVar3 = Quit;
  }
  else {
    DVar1 = DeclarationSymbol::category((DeclarationSymbol *)this_00);
    if (DVar1 < Type) {
      pMVar5 = MIXIN_TypeableDeclarationSymbol::from((DeclarationSymbol *)this_00);
      if (pMVar5 == (MIXIN_TypeableDeclarationSymbol *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                   ,0x60);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x85);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"<empty message>",0xf);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        goto LAB_002ea4e1;
      }
      iVar4 = (*pMVar5->_vptr_MIXIN_TypeableDeclarationSymbol[2])(pMVar5);
      pSVar6 = DeclarationSymbol::enclosingScope((DeclarationSymbol *)this_00);
      pTVar7 = canonicalize(this,(Type *)CONCAT44(extraout_var,iVar4),pSVar6);
      (*pMVar5->_vptr_MIXIN_TypeableDeclarationSymbol[3])(pMVar5,pTVar7);
    }
    else if (DVar1 == Type) {
      SVar2 = Symbol::kind(this_00);
      if (SVar2 != TypedefDeclaration) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeCanonicalizer.cpp"
                   ,0x60);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        iVar4 = 0x7b;
        goto LAB_002ea37e;
      }
      iVar4 = (*this_00->_vptr_Symbol[0x22])(this_00);
      pTVar7 = TypedefDeclarationSymbol::synonymizedType
                         ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_00,iVar4));
      pSVar6 = DeclarationSymbol::enclosingScope((DeclarationSymbol *)this_00);
      pTVar7 = canonicalize(this,pTVar7,pSVar6);
      TypedefDeclarationSymbol::setSynonymizedType
                ((TypedefDeclarationSymbol *)CONCAT44(extraout_var_00,iVar4),pTVar7);
    }
    AVar3 = Skip;
  }
  return AVar3;
}

Assistant:

SyntaxVisitor::Action TypeCanonicalizer::visitDeclarator_COMMON(const DeclaratorSyntax* node)
{
    auto decl = semaModel_->declarationBy(node);
    PSY_ASSERT_2(decl, return Action::Quit);
    switch (decl->category()) {
        case DeclarationCategory::Type: {
            PSY_ASSERT_2(decl->kind() == SymbolKind::TypedefDeclaration, return Action::Quit);
            auto tydefDecl = decl->asTypedefDeclaration();
            auto canonTy = canonicalize(tydefDecl->synonymizedType(), decl->enclosingScope());
            tydefDecl->setSynonymizedType(canonTy);
            break;
        }
        case DeclarationCategory::Member:
        case DeclarationCategory::Function:
        case DeclarationCategory::Object: {
            auto typeableDecl = MIXIN_TypeableDeclarationSymbol::from(decl);
            PSY_ASSERT_2(typeableDecl, return Action::Quit);
            auto ty = typeableDecl->type();
            auto canonTy = canonicalize(ty, decl->enclosingScope());
            typeableDecl->setType(canonTy);
            break;
        }
    }

    return Action::Skip;
}